

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  long lVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string comment;
  string local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (messenger != (cmMessenger *)0x0) {
      local_78.first._M_len = 9;
      local_78.first._M_str = "Value of ";
      local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_58 = (key->_M_dataplus)._M_p;
      local_60 = key->_M_string_length;
      local_50 = 0;
      local_48 = 0x20;
      local_40 = " contained a newline; truncating";
      local_38 = 0;
      views._M_len = 3;
      views._M_array = &local_78;
      cmCatViews(&local_98,views);
      local_78.first._M_len = 0;
      local_78.first._M_str = (char *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_78);
      cmMessenger::IssueMessage(messenger,WARNING,&local_98,(cmListFileBacktrace *)&local_78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.first._M_str !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.first._M_str);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    local_78.first._M_len = 0x12;
    local_78.first._M_str = "WARNING: Value of ";
    local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58 = (key->_M_dataplus)._M_p;
    local_60 = key->_M_string_length;
    local_50 = 0;
    local_48 = 0x37;
    local_40 = " contained a newline and was truncated. Original value:";
    local_38 = 0;
    views_00._M_len = 3;
    views_00._M_array = &local_78;
    cmCatViews(&local_98,views_00);
    OutputWarningComment(fout,&local_98,true);
    OutputWarningComment(fout,value,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message =
        cmStrCat("Value of ", key, " contained a newline; truncating");
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment =
      cmStrCat("WARNING: Value of ", key,
               " contained a newline and was truncated. Original value:");

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}